

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_FailSet_Test::TestBody(TApp_FailSet_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<int> __l_01;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  AssertHelper local_1d8;
  Message local_1d0 [2];
  ConversionError *anon_var_0_1;
  char *pcStack_1b8;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  iterator local_180;
  size_type local_178;
  AssertHelper local_170;
  Message local_168 [2];
  ArgumentMismatch *anon_var_0;
  char *pcStack_150;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [32];
  string local_f8 [32];
  iterator local_d8;
  size_type local_d0;
  allocator local_c1;
  string local_c0;
  allocator<int> local_9e;
  less<int> local_9d;
  int local_9c [3];
  iterator local_90;
  size_type local_88;
  set<int,_std::less<int>,_std::allocator<int>_> local_80;
  allocator local_39;
  string local_38;
  int local_14;
  TApp_FailSet_Test *pTStack_10;
  int choice;
  TApp_FailSet_Test *this_local;
  
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"-q,--quick",&local_39);
  local_9c[0] = 1;
  local_9c[1] = 2;
  local_9c[2] = 3;
  local_90 = local_9c;
  local_88 = 3;
  CLI::std::allocator<int>::allocator(&local_9e);
  __l_01._M_len = local_88;
  __l_01._M_array = local_90;
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (&local_80,__l_01,&local_9d,&local_9e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  CLI::App::add_set<int>(&(this->super_TApp).app,&local_38,&local_14,&local_80,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_80);
  CLI::std::allocator<int>::~allocator(&local_9e);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  gtest_msg.value._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"--quick",(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"3",(allocator *)((long)&gtest_msg.value + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"--quick=2",(allocator *)((long)&gtest_msg.value + 5));
  gtest_msg.value._4_1_ = 0;
  local_d8 = &local_138;
  local_d0 = 3;
  __l_00._M_len = 3;
  __l_00._M_array = local_d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
  do {
    local_238 = local_238 + -1;
    std::__cxx11::string::~string((string *)local_238);
  } while (local_238 != &local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffeb0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffeb0);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0013e820;
    pcStack_150 = 
    "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_168);
  testing::internal::AssertHelper::AssertHelper
            (&local_170,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x364,pcStack_150);
  testing::internal::AssertHelper::operator=(&local_170,local_168);
  testing::internal::AssertHelper::~AssertHelper(&local_170);
  testing::Message::~Message(local_168);
LAB_0013e820:
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a0,"--quick=hello",(allocator *)((long)&gtest_msg_1.value + 7));
  gtest_msg_1.value._6_1_ = 0;
  local_180 = &local_1a0;
  local_178 = 1;
  __l._M_len = 1;
  __l._M_array = local_180;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180;
  do {
    local_290 = local_290 + -1;
    std::__cxx11::string::~string((string *)local_290);
  } while (local_290 != &local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe48,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe48);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) {
      return;
    }
    pcStack_1b8 = 
    "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1d0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x369,pcStack_1b8);
  testing::internal::AssertHelper::operator=(&local_1d8,local_1d0);
  testing::internal::AssertHelper::~AssertHelper(&local_1d8);
  testing::Message::~Message(local_1d0);
  return;
}

Assistant:

TEST_F(TApp, FailSet) {

    int choice;
    app.add_set("-q,--quick", choice, {1, 2, 3});

    args = {"--quick", "3", "--quick=2"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();

    args = {"--quick=hello"};
    EXPECT_THROW(run(), CLI::ConversionError);
}